

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-coroutine-test.c++
# Opt level: O2

Promise<int> __thiscall kj::anon_unknown_0::identity<int>(anon_unknown_0 *this,int *value)

{
  SourceLocation location;
  coroutine_handle<void> handle;
  
  handle._M_fr_ptr = operator_new(0x240);
  *(code **)handle._M_fr_ptr = identity<int>;
  *(code **)((long)handle._M_fr_ptr + 8) = identity<int>;
  location.function = "identity";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
  ;
  location.lineNumber = 0x20;
  location.columnNumber = 0x17;
  kj::_::Coroutine<int>::Coroutine
            ((Coroutine<int> *)((long)handle._M_fr_ptr + 0x10),handle,location);
  kj::_::Coroutine<int>::get_return_object((Coroutine<int> *)this);
  kj::_::CoroutineMixin<kj::_::Coroutine<int>,_int>::return_value
            ((CoroutineMixin<kj::_::Coroutine<int>,_int> *)((long)handle._M_fr_ptr + 0x10),*value);
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x238) = 0;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<kj::Decay<T>> identity(T&& value) {
  co_return kj::fwd<T>(value);
}